

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobject.h
# Opt level: O2

uint64_t fiobj_obj2hash(FIOBJ o)

{
  uint64_t uVar1;
  fio_str_info_s s;
  fio_str_info_s local_20;
  
  if (((uint)o & 7) == 2) {
    uVar1 = fiobj_str_hash(o);
    return uVar1;
  }
  if ((((~(uint)o & 6) != 0) && (o != 0)) && ((o & 1) == 0)) {
    fiobj_obj2cstr(&local_20,o);
    o = fio_siphash13(local_20.data,local_20.len,0x13d547,0x13d858);
  }
  return o;
}

Assistant:

FIO_INLINE uint64_t fiobj_obj2hash(const FIOBJ o) {
  if (FIOBJ_TYPE_IS(o, FIOBJ_T_STRING))
    return fiobj_str_hash(o);
  if (!FIOBJ_IS_ALLOCATED(o))
    return (uint64_t)o;
  fio_str_info_s s = fiobj_obj2cstr(o);
  return FIO_HASH_FN(s.data, s.len, &fiobj_each2, &fiobj_free_complex_object);
}